

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage9.cpp
# Opt level: O2

void test(bool verbose)

{
  atomic_llong aVar1;
  atomic_llong aVar2;
  atomic_llong aVar3;
  atomic_llong aVar4;
  memory_resource *pmVar5;
  ostream *poVar6;
  __atomic_base<int> _Var7;
  Framer framer;
  pstring astring;
  pstring mstring;
  test_resource tr;
  test_resource dr;
  
  Framer::Framer(&framer,"Monitoring",verbose);
  std::pmr::test_resource::test_resource(&dr,"default");
  aVar4 = dr.m_total_blocks_;
  aVar3 = dr.m_blocks_in_use_;
  pmVar5 = (memory_resource *)std::pmr::set_default_resource(&dr.super_memory_resource);
  _Var7._M_i._1_3_ = 0;
  _Var7._M_i._0_1_ = verbose;
  dr.m_verbose_flag_.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)_Var7._M_i;
  std::pmr::test_resource::test_resource(&tr,"object");
  aVar2 = tr.m_total_blocks_;
  aVar1 = tr.m_blocks_in_use_;
  tr.m_verbose_flag_.super___atomic_base<int>._M_i =
       (__atomic_base<int>)(__atomic_base<int>)_Var7._M_i;
  pstring::pstring(&astring,"barfool",(allocator_type)&tr);
  if (tr.m_total_blocks_.super___atomic_base<long_long>._M_i ==
      aVar2.super___atomic_base<long_long>._M_i) {
    poVar6 = std::operator<<((ostream *)&std::cout,"trm.is_total_up()");
    std::operator<<(poVar6," != true\n");
  }
  if ((long)tr.m_blocks_in_use_.super___atomic_base<long_long>._M_i -
      (long)aVar1.super___atomic_base<long_long>._M_i != 1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"trm.delta_blocks_in_use()");
    poVar6 = std::operator<<(poVar6," != ");
    poVar6 = std::operator<<(poVar6,"1");
    std::operator<<(poVar6,'\n');
    poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    poVar6 = std::operator<<(poVar6," != ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
    std::operator<<(poVar6,'\n');
  }
  pstring::pstring(&mstring,&astring);
  if (dr.m_blocks_in_use_.super___atomic_base<long_long>._M_i !=
      aVar3.super___atomic_base<long_long>._M_i) {
    poVar6 = std::operator<<((ostream *)&std::cout,"drm.is_in_use_same()");
    std::operator<<(poVar6," != true\n");
  }
  if (dr.m_total_blocks_.super___atomic_base<long_long>._M_i !=
      aVar4.super___atomic_base<long_long>._M_i) {
    poVar6 = std::operator<<((ostream *)&std::cout,"drm.is_total_same()");
    std::operator<<(poVar6," != true\n");
  }
  pstring::~pstring(&mstring);
  pstring::~pstring(&astring);
  std::pmr::test_resource::~test_resource(&tr);
  std::pmr::set_default_resource(pmVar5);
  std::pmr::test_resource::~test_resource(&dr);
  Framer::~Framer(&framer);
  return;
}

Assistant:

void test(bool verbose)
{
    Framer framer{ "Monitoring", verbose };

    std::pmr::test_resource           dr{ "default" };
    std::pmr::test_resource_monitor  drm{ dr };
    std::pmr::default_resource_guard drg{ &dr };
    dr.set_verbose(verbose);

    std::pmr::test_resource          tr{ "object" };
    std::pmr::test_resource_monitor trm{ tr };
    tr.set_verbose(verbose);

    pstring astring{ "barfool", &tr };
    ASSERT(trm.is_total_up());
    ASSERT_EQ(trm.delta_blocks_in_use(), 1);
    trm.reset();

    pstring mstring{ std::move(astring) };

    ASSERT(drm.is_in_use_same()); // Did not allocate`bstring` with this
    ASSERT(drm.is_total_same());  // Did not allocate /anything/ with this
}